

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::exceptions::option_has_no_value::option_has_no_value
          (option_has_no_value *this,string *option)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  long *plVar3;
  long *plVar4;
  ulong *puVar5;
  ulong *local_a8;
  size_type local_a0;
  ulong local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar2 = option->_M_string_length;
  if (sVar2 == 0) {
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Option has no value","");
  }
  else {
    std::operator+(&local_48,"Option ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::LQUOTE_abi_cxx11_);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_48,(ulong)(option->_M_dataplus)._M_p);
    local_88 = &local_78;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_78 = *plVar4;
      lStack_70 = plVar3[3];
    }
    else {
      local_78 = *plVar4;
      local_88 = (long *)*plVar3;
    }
    local_80 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_88,(anonymous_namespace)::RQUOTE_abi_cxx11_);
    local_68 = &local_58;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar3[3];
    }
    else {
      local_58 = *plVar4;
      local_68 = (long *)*plVar3;
    }
    local_60 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_a8 = &local_98;
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_98 = *puVar5;
      lStack_90 = plVar3[3];
    }
    else {
      local_98 = *puVar5;
      local_a8 = (ulong *)*plVar3;
    }
    local_a0 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  *(undefined ***)&this->super_exception = &PTR__exception_0025e2f8;
  paVar1 = &(this->super_exception).m_message.field_2;
  (this->super_exception).m_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_a8 == &local_98) {
    paVar1->_M_allocated_capacity = local_98;
    *(long *)((long)&(this->super_exception).m_message.field_2 + 8) = lStack_90;
  }
  else {
    (this->super_exception).m_message._M_dataplus._M_p = (pointer)local_a8;
    (this->super_exception).m_message.field_2._M_allocated_capacity = local_98;
  }
  (this->super_exception).m_message._M_string_length = local_a0;
  local_a0 = 0;
  local_98 = local_98 & 0xffffffffffffff00;
  if (sVar2 != 0) {
    local_a8 = &local_98;
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,local_78 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  *(undefined ***)&this->super_exception = &PTR__exception_0025f080;
  return;
}

Assistant:

explicit option_has_no_value(const std::string& option)
  : exception(
      !option.empty() ?
      ("Option " + LQUOTE + option + RQUOTE + " has no value") :
      "Option has no value")
  {
  }